

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkmsdevice.cpp
# Opt level: O0

drmModeAtomicReq * __thiscall QKmsDevice::threadLocalAtomicRequest(QKmsDevice *this)

{
  AtomicReqs *pAVar1;
  drmModeAtomicReq *pdVar2;
  long in_RDI;
  AtomicReqs *a;
  drmModeAtomicReq *local_8;
  
  if ((*(byte *)(in_RDI + 0x2c) & 1) == 0) {
    local_8 = (drmModeAtomicReq *)0x0;
  }
  else {
    pAVar1 = QThreadStorage<QKmsDevice::AtomicReqs>::localData
                       ((QThreadStorage<QKmsDevice::AtomicReqs> *)0x11b445);
    if (pAVar1->request == (drmModeAtomicReq *)0x0) {
      pdVar2 = (drmModeAtomicReq *)drmModeAtomicAlloc();
      pAVar1->request = pdVar2;
    }
    local_8 = pAVar1->request;
  }
  return local_8;
}

Assistant:

drmModeAtomicReq *QKmsDevice::threadLocalAtomicRequest()
{
    if (!m_has_atomic_support)
        return nullptr;

    AtomicReqs &a(m_atomicReqs.localData());
    if (!a.request)
        a.request = drmModeAtomicAlloc();

    return a.request;
}